

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O3

void __thiscall asl::XdlEncoder::new_number(XdlEncoder *this,float x)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  
  if (0x7f7fffff < (uint)ABS(x)) {
    if (NAN(x)) {
      pcVar3 = "null";
      iVar2 = 4;
    }
    else {
      pcVar3 = "1e400";
      if (x < 0.0) {
        pcVar3 = "-1e400";
      }
      iVar2 = (x < 0.0) + 5;
    }
    String::append(&this->_out,pcVar3,iVar2);
    return;
  }
  iVar2 = (this->_out)._len;
  String::resize(&this->_out,iVar2 + 0x10,true,true);
  paVar5 = &(this->_out).field_2;
  paVar4 = paVar5;
  if ((this->_out)._size != 0) {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_out).field_2._str;
  }
  iVar1 = snprintf(paVar4->_space + iVar2,0x11,this->_fmtF,SUB84((double)x,0));
  (this->_out)._len = iVar1 + iVar2;
  if ((this->_out)._size != 0) {
    paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_out).field_2._str;
  }
  pcVar3 = paVar5->_space + iVar2;
  while( true ) {
    if (*pcVar3 == '\0') {
      return;
    }
    if (*pcVar3 == ',') break;
    pcVar3 = pcVar3 + 1;
  }
  *pcVar3 = '.';
  return;
}

Assistant:

void XdlEncoder::new_number(float x)
{
	int n = _out.length();
#if defined(_MSC_VER) && _MSC_VER < 1800
	if (!_finite(x))
#else
	if (!isfinite(x))
#endif
	{
		if (x != x)
			_out << "null";
		else
			_out << ((x < 0) ? "-1e400" : "1e400");
		return;
	}
	_out.resize(n + 16);
	_out.fix(n + snprintf(&_out[n], 17, _fmtF, x));

	// Fix decimal comma of some locales
#ifndef ASL_NO_FIX_DOT
	char* p = &_out[n];
	while (*p)
	{
		if (*p == ',') {
			*p = '.';
			break;
		}
		p++;
	}
#endif
}